

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O3

void __thiscall Gameplay::ArrangeTurns(Gameplay *this)

{
  Gameplay *pGVar1;
  Gameplay *pGVar2;
  int iVar3;
  int iVar4;
  Gameplay *pGVar5;
  
  pGVar1 = (Gameplay *)
           (this->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
           super__List_node_base._M_next;
  (this->it)._M_node = (_List_node_base *)pGVar1;
  while (pGVar2 = pGVar1, pGVar1 != this) {
    for (; pGVar1 != this;
        pGVar1 = (Gameplay *)
                 (pGVar1->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node
                 .super__List_node_base._M_next) {
      iVar3 = Player::getHonour((Player *)
                                &(pGVar1->players).super__List_base<Player,_std::allocator<Player>_>
                                 ._M_impl._M_node._M_size);
      iVar4 = Player::getHonour((Player *)
                                &(pGVar2->players).super__List_base<Player,_std::allocator<Player>_>
                                 ._M_impl._M_node._M_size);
      pGVar5 = pGVar1;
      if (iVar3 <= iVar4) {
        pGVar5 = pGVar2;
      }
      pGVar2 = pGVar5;
    }
    (this->it)._M_node = (_List_node_base *)pGVar2;
    pGVar1 = (Gameplay *)
             (pGVar2->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
             super__List_node_base._M_next;
    (this->it)._M_node = (_List_node_base *)pGVar1;
  }
  return;
}

Assistant:

void Gameplay::ArrangeTurns()                                   //selection sorting in decreasing order players list by honour
{
    list <Player>::iterator max, i;

    for (it=players.begin(); it!=players.end(); it++)
    {
        max = it;
        for (i=it; i!=players.end(); i++)
        {
            if (i->getHonour() > max->getHonour())
                max = i;
        }
        swap(--it, max);
    }
}